

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

int Abc_NtkIsTopo(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  
  Abc_NtkIncrementTravId(pNtk);
  for (iVar3 = 0; iVar3 < pNtk->vCis->nSize; iVar3 = iVar3 + 1) {
    pAVar2 = Abc_NtkCi(pNtk,iVar3);
    Abc_NodeSetTravIdCurrent(pAVar2);
  }
  iVar3 = 0;
  uVar4 = 0;
  do {
    if (pNtk->vObjs->nSize <= iVar3) {
      if (uVar4 != 0) {
        printf("Topological order does not hold for %d internal nodes.\n",(ulong)uVar4);
      }
      return (int)(uVar4 == 0);
    }
    pAVar2 = Abc_NtkObj(pNtk,iVar3);
    if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) {
      for (lVar5 = 0; iVar1 = (pAVar2->vFanins).nSize, lVar5 < iVar1; lVar5 = lVar5 + 1) {
        iVar1 = Abc_NodeIsTravIdCurrent
                          ((Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanins).pArray[lVar5]]
                          );
        if (iVar1 == 0) {
          iVar1 = (pAVar2->vFanins).nSize;
          break;
        }
      }
      if (iVar1 != (int)lVar5) {
        if (uVar4 == 0) {
          printf("Node %d is out of topo order.\n",(ulong)(uint)pAVar2->Id);
          uVar4 = 1;
        }
        else {
          uVar4 = uVar4 + 1;
        }
      }
      Abc_NodeSetTravIdCurrent(pAVar2);
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

int Abc_NtkIsTopo( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pFanin;
    int i, k, Counter = 0;
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachCi( pNtk, pObj, i )
        Abc_NodeSetTravIdCurrent(pObj);
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        // check if fanins are in the topo order
        Abc_ObjForEachFanin( pObj, pFanin, k )
            if ( !Abc_NodeIsTravIdCurrent(pFanin) )
                break;
        if ( k != Abc_ObjFaninNum(pObj) )
        {
            if ( Counter++ == 0 )
                printf( "Node %d is out of topo order.\n", Abc_ObjId(pObj) );
        }
        Abc_NodeSetTravIdCurrent(pObj);
    }
    if ( Counter )
        printf( "Topological order does not hold for %d internal nodes.\n", Counter );
    return (int)(Counter == 0);
}